

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O1

void mc_rbi_map_twist_to_momentum(mc_rbi *m,gc_twist *xd,mc_momentum *r)

{
  vector3 hxw;
  vector3 hxv;
  
  if (m == (mc_rbi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x111,
                  "void mc_rbi_map_twist_to_momentum(const struct mc_rbi *, const struct gc_twist *, struct mc_momentum *)"
                 );
  }
  if (xd != (gc_twist *)0x0) {
    if (r != (mc_momentum *)0x0) {
      la_dcross_o((double *)&m->first_moment_of_mass,1,(double *)xd->linear_velocity,1,
                  (double *)&hxv,1);
      la_dgemv_noe(3,3,1.0,(double *)&m->second_moment_of_mass,3,(double *)xd->angular_velocity,1,
                   1.0,(double *)&hxv,1,(double *)r->angular_momentum,1);
      la_dcross_o((double *)&m->first_moment_of_mass,1,(double *)xd->angular_velocity,1,
                  (double *)&hxw,1);
      la_dscal_o(3,m->zeroth_moment_of_mass,(double *)xd->linear_velocity,1,
                 (double *)r->linear_momentum,1);
      la_daxpy_ie(3,-1.0,(double *)&hxw,1,(double *)r->linear_momentum,1);
      return;
    }
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x113,
                  "void mc_rbi_map_twist_to_momentum(const struct mc_rbi *, const struct gc_twist *, struct mc_momentum *)"
                 );
  }
  __assert_fail("xd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x112,
                "void mc_rbi_map_twist_to_momentum(const struct mc_rbi *, const struct gc_twist *, struct mc_momentum *)"
               );
}

Assistant:

void mc_rbi_map_twist_to_momentum(
        const struct mc_rbi *m,
        const struct gc_twist *xd,
        struct mc_momentum *r)
{
    assert(m);
    assert(xd);
    assert(r);

    // h x v
    struct vector3 hxv;
    la_dcross_o(
            (double *)&m->first_moment_of_mass, 1,
            (double *)xd->linear_velocity, 1,
            (double *)&hxv, 1);

    // n = I w + h x v
    la_dgemv_noe(3, 3,
            1.0, (double *)&m->second_moment_of_mass, 3, (double *)xd->angular_velocity, 1,
            1.0, (double *)&hxv, 1,
            (double *)r->angular_momentum, 1);

    // h x w
    struct vector3 hxw;
    la_dcross_o(
            (double *)&m->first_moment_of_mass, 1,
            (double *)xd->angular_velocity, 1,
            (double *)&hxw, 1);

    // m v
    la_dscal_o(3,
            m->zeroth_moment_of_mass,
            (double *)xd->linear_velocity, 1,
            (double *)r->linear_momentum, 1);

    // f = m v - h x w
    la_daxpy_ie(3,
            -1.0, (double *)&hxw, 1,
            (double *)r->linear_momentum, 1);
}